

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

ostream * __thiscall
wasm::ValidationInfo::fail<wasm::Expression*,char_const*>
          (ValidationInfo *this,char *text,Expression *curr,Function *func)

{
  ostringstream *poVar1;
  size_t sVar2;
  ostream *poVar3;
  
  LOCK();
  (this->valid)._M_base._M_i = false;
  UNLOCK();
  poVar1 = getStream_abi_cxx11_(this,func);
  if (this->quiet != false) {
    return (ostream *)poVar1;
  }
  poVar1 = printFailureHeader_abi_cxx11_(this,func);
  if (text == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(text);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,text,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", on \n",6);
  poVar3 = printModuleComponent(curr,poVar1,this->wasm);
  return poVar3;
}

Assistant:

std::ostream& fail(S text, T curr, Function* func) {
    valid.store(false);
    auto& stream = getStream(func);
    if (quiet) {
      return stream;
    }
    auto& ret = printFailureHeader(func);
    ret << text << ", on \n";
    return printModuleComponent(curr, ret, wasm);
  }